

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

void HistogramClear(VP8LHistogram *p)

{
  undefined4 uVar1;
  undefined8 uVar2;
  int iVar3;
  undefined8 *in_RDI;
  int histo_size;
  int cache_bits;
  uint32_t *literal;
  
  uVar2 = *in_RDI;
  uVar1 = *(undefined4 *)(in_RDI + 0x195);
  iVar3 = VP8LGetHistogramSize((int)((ulong)uVar2 >> 0x20));
  memset(in_RDI,0,(long)iVar3);
  *(undefined4 *)(in_RDI + 0x195) = uVar1;
  *in_RDI = uVar2;
  return;
}

Assistant:

static void HistogramClear(VP8LHistogram* const p) {
  uint32_t* const literal = p->literal_;
  const int cache_bits = p->palette_code_bits_;
  const int histo_size = VP8LGetHistogramSize(cache_bits);
  memset(p, 0, histo_size);
  p->palette_code_bits_ = cache_bits;
  p->literal_ = literal;
}